

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall Name::EncodedSize(Name *this)

{
  size_t sVar1;
  Name *this_local;
  
  sVar1 = DerBase::EncodedSize(&(this->rdnSequence).super_DerBase);
  return sVar1;
}

Assistant:

virtual size_t EncodedSize() const override
    {
        return rdnSequence.EncodedSize();
    }